

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetFullExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  Descriptor *pDVar1;
  FileDescriptor *this_00;
  Descriptor *descriptor_00;
  FieldDescriptor *descriptor_01;
  FileDescriptor *descriptor_02;
  FieldDescriptor *descriptor_03;
  AlphaNum *in_R8;
  string local_1c8;
  AlphaNum local_1a8;
  AlphaNum local_178;
  string local_148;
  AlphaNum local_128;
  string local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  string local_68;
  AlphaNum local_48;
  FieldDescriptor *local_18;
  FieldDescriptor *descriptor_local;
  
  local_18 = (FieldDescriptor *)this;
  descriptor_local = (FieldDescriptor *)__return_storage_ptr__;
  pDVar1 = FieldDescriptor::extension_scope((FieldDescriptor *)this);
  if (pDVar1 == (Descriptor *)0x0) {
    this_00 = FieldDescriptor::file(local_18);
    GetExtensionClassUnqualifiedName_abi_cxx11_(&local_148,(csharp *)this_00,descriptor_02);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_128,&local_148);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_178,".");
    GetPropertyName_abi_cxx11_(&local_1c8,(csharp *)local_18,descriptor_03);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1a8,&local_1c8);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_128,&local_178,&local_1a8,in_R8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_148);
  }
  else {
    pDVar1 = FieldDescriptor::extension_scope(local_18);
    GetClassName_abi_cxx11_(&local_68,(csharp *)pDVar1,descriptor_00);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_48,&local_68);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,".Extensions.");
    GetPropertyName_abi_cxx11_(&local_f8,(csharp *)local_18,descriptor_01);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_d8,&local_f8);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_a8,&local_d8,in_R8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullExtensionName(const FieldDescriptor* descriptor) {
  if (descriptor->extension_scope()) {
    return absl::StrCat(GetClassName(descriptor->extension_scope()),
                        ".Extensions.", GetPropertyName(descriptor));
  }

  return absl::StrCat(GetExtensionClassUnqualifiedName(descriptor->file()), ".",
                      GetPropertyName(descriptor));
}